

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test_fibonacci(void)

{
  element_type *peVar1;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> res0;
  shared_ptr<vmips::VirtReg> n;
  shared_ptr<vmips::VirtReg> m;
  shared_ptr<vmips::VirtReg> res1;
  shared_ptr<vmips::VirtReg> sum;
  shared_ptr<vmips::VirtReg> one;
  shared_ptr<vmips::VirtReg> zero;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> local_70;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  br.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  std::make_shared<vmips::Function,char_const(&)[10],int>((char (*) [10])&f,(int *)"fibonacci");
  vmips::get_special((SpecialReg)&zero);
  vmips::Function::entry();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  br.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&one,
             (shared_ptr<vmips::VirtReg> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(int *)&zero);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vmips::get_special((SpecialReg)&m);
  vmips::Function::
  branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            (&br,peVar1,&m,&one);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vmips::get_special((SpecialReg)&n);
  res0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xffffffff;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            ((Function *)&m,(shared_ptr<vmips::VirtReg> *)peVar1,(int *)&n);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&n.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vmips::get_special((SpecialReg)&res0);
  res1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xfffffffe;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            ((Function *)&n,(shared_ptr<vmips::VirtReg> *)peVar1,(int *)&res0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_50,&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&res0,(weak_ptr<vmips::Function> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)local_50);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_48);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_60,&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&res1,(weak_ptr<vmips::Function> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)local_60);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_58);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&sum,
             (shared_ptr<vmips::VirtReg> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&res0);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&sum.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::assign_special(peVar1,2,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  vmips::Function::add_ret();
  vmips::Function::switch_to
            (f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::assign_special
            ((SpecialReg)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,2)
  ;
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::color();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::scan_overlap();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::handle_alloca();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sum.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&n.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair(&br);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&one.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&zero.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_fibonacci() {
    auto f  = std::make_shared<Function>("fibonacci", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto one = f->append<addi>(zero, 1);
    auto br = f->branch<ble>(get_special(SpecialReg::a0), one);

    // arg > 1
    auto m = f->append<addi>(get_special(SpecialReg::a0), -1);
    auto n = f->append<addi>(get_special(SpecialReg::a0), -2);
    auto res0 = f->call(f, m);
    auto res1 = f->call(f, n);
    auto sum = f->append<add>(res0, res1);
    f->assign_special(SpecialReg::v0, sum);
    f->add_ret();

    // arg <= 1
    f->switch_to(br.second);
    f->assign_special(SpecialReg::v0, 1);

    f->output(std::cout);

    f->color();
    std::cout << std::endl;
    f->output(std::cout);

    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);

    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}